

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

void mi_segment_free(mi_segment_t *segment,_Bool force,mi_segments_tld_t *tld)

{
  mi_segments_tld_t *tld_00;
  mi_segment_t *in_RDI;
  mi_slice_t *end;
  mi_slice_t *slice;
  mi_segments_tld_t *slice_00;
  
  if ((in_RDI->dont_free & 1U) == 0) {
    slice_00 = (mi_segments_tld_t *)in_RDI->slices;
    tld_00 = (mi_segments_tld_t *)mi_segment_slices_end(in_RDI);
    for (; slice_00 < tld_00;
        slice_00 = (mi_segments_tld_t *)
                   (slice_00->spans + (ulong)*(uint *)&slice_00->spans[0].first * 4)) {
      if ((slice_00->spans[1].slice_count == 0) && (in_RDI->kind != MI_SEGMENT_HUGE)) {
        mi_segment_span_remove_from_queue((mi_slice_t *)slice_00,tld_00);
      }
    }
    mi_segment_os_free((mi_segment_t *)tld,(mi_segments_tld_t *)slice);
  }
  return;
}

Assistant:

static void mi_segment_free(mi_segment_t* segment, bool force, mi_segments_tld_t* tld) {
  MI_UNUSED(force);
  mi_assert_internal(segment != NULL);
  mi_assert_internal(segment->next == NULL);
  mi_assert_internal(segment->used == 0);

  // in `mi_segment_force_abandon` we set this to true to ensure the segment's memory stays valid
  if (segment->dont_free) return;

  // Remove the free pages
  mi_slice_t* slice = &segment->slices[0];
  const mi_slice_t* end = mi_segment_slices_end(segment);
  #if MI_DEBUG>1
  size_t page_count = 0;
  #endif
  while (slice < end) {
    mi_assert_internal(slice->slice_count > 0);
    mi_assert_internal(slice->slice_offset == 0);
    mi_assert_internal(mi_slice_index(slice)==0 || slice->block_size == 0); // no more used pages ..
    if (slice->block_size == 0 && segment->kind != MI_SEGMENT_HUGE) {
      mi_segment_span_remove_from_queue(slice, tld);
    }
    #if MI_DEBUG>1
    page_count++;
    #endif
    slice = slice + slice->slice_count;
  }
  mi_assert_internal(page_count == 2); // first page is allocated by the segment itself

  // stats
  // _mi_stat_decrease(&tld->stats->page_committed, mi_segment_info_size(segment));

  // return it to the OS
  mi_segment_os_free(segment, tld);
}